

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::set_state(torrent *this,state_t s)

{
  bool bVar1;
  int iVar2;
  state_t sVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  alert_manager *paVar4;
  __shared_ptr_access<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00
  ;
  element_type *peVar5;
  bool local_a1;
  shared_ptr<libtorrent::torrent_plugin> *ext;
  iterator __end2;
  iterator __begin2;
  list<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
  *__range2;
  undefined1 local_50 [7];
  bool trigger_stop;
  state_t local_2c;
  undefined1 local_28 [28];
  state_t s_local;
  torrent *this_local;
  
  if (((state_t)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39) &
      checking_resume_data) != s) {
    local_28._20_4_ = s;
    unique0x10000462 = this;
    iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    bVar1 = alert_manager::should_post<libtorrent::state_changed_alert>
                      ((alert_manager *)CONCAT44(extraout_var,iVar2));
    if (bVar1) {
      iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)local_28);
      local_2c = (state_t)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >>
                          0x39) & checking_resume_data;
      alert_manager::
      emplace_alert<libtorrent::state_changed_alert,libtorrent::torrent_handle,libtorrent::torrent_status::state_t_const&,libtorrent::torrent_status::state_t>
                ((alert_manager *)CONCAT44(extraout_var_00,iVar2),(torrent_handle *)local_28,
                 (state_t *)(local_28 + 0x14),&local_2c);
      torrent_handle::~torrent_handle((torrent_handle *)local_28);
    }
    if (local_28._20_4_ == finished) {
      paVar4 = alerts(this);
      bVar1 = alert_manager::should_post<libtorrent::torrent_finished_alert>(paVar4);
      if (bVar1) {
        paVar4 = alerts(this);
        get_handle((torrent *)local_50);
        alert_manager::emplace_alert<libtorrent::torrent_finished_alert,libtorrent::torrent_handle>
                  (paVar4,(torrent_handle *)local_50);
        torrent_handle::~torrent_handle((torrent_handle *)local_50);
      }
    }
    local_a1 = false;
    if (((byte)this->field_0x5cc >> 4 & 1) != 0) {
      bVar1 = anon_unknown_135::is_downloading_state
                        ((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48
                               >> 0x39) & 7);
      local_a1 = false;
      if (!bVar1) {
        local_a1 = anon_unknown_135::is_downloading_state(local_28._20_4_);
      }
    }
    __range2._7_1_ = local_a1;
    *(ulong *)&(this->super_torrent_hot_members).field_0x48 =
         *(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0xf1ffffffffffffff |
         ((ulong)(uint)local_28._20_4_ & 7) << 0x39;
    update_gauge(this);
    update_want_peers(this);
    update_want_tick(this);
    update_state_list(this);
    state_updated(this);
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"set_state() %d",
               (ulong)((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >>
                             0x39) & 7));
    if ((__range2._7_1_ & 1) != 0) {
      (*(this->super_request_callback)._vptr_request_callback[7])();
      auto_managed(this,false);
      libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void>::
      bitfield_flag((bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void> *)
                    ((long)&__range2 + 6));
      pause(this);
      this->field_0x5cc = this->field_0x5cc & 0xef;
    }
    __end2 = ::std::__cxx11::
             list<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
             ::begin(&this->m_extensions);
    ext = (shared_ptr<libtorrent::torrent_plugin> *)
          ::std::__cxx11::
          list<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
          ::end(&this->m_extensions);
    while (bVar1 = ::std::operator!=(&__end2,(_Self *)&ext), bVar1) {
      this_00 = (__shared_ptr_access<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)::std::_List_iterator<std::shared_ptr<libtorrent::torrent_plugin>_>::operator*
                             (&__end2);
      peVar5 = ::std::
               __shared_ptr_access<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(this_00);
      sVar3 = state(this);
      (*peVar5->_vptr_torrent_plugin[9])(peVar5,(ulong)sVar3);
      ::std::_List_iterator<std::shared_ptr<libtorrent::torrent_plugin>_>::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void torrent::set_state(torrent_status::state_t const s)
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(s != 0); // this state isn't used anymore

#if TORRENT_USE_ASSERTS

		if (s == torrent_status::seeding)
		{
			TORRENT_ASSERT(is_seed());
			TORRENT_ASSERT(is_finished());
		}
		if (s == torrent_status::finished)
			TORRENT_ASSERT(is_finished());
		if (s == torrent_status::downloading && m_state == torrent_status::finished)
			TORRENT_ASSERT(!is_finished());
#endif

		if (int(m_state) == s) return;

		if (m_ses.alerts().should_post<state_changed_alert>())
		{
			m_ses.alerts().emplace_alert<state_changed_alert>(get_handle()
				, s, static_cast<torrent_status::state_t>(m_state));
		}

		if (s == torrent_status::finished
			&& alerts().should_post<torrent_finished_alert>())
		{
			alerts().emplace_alert<torrent_finished_alert>(
				get_handle());
		}

		bool const trigger_stop = m_stop_when_ready
			&& !is_downloading_state(m_state)
			&& is_downloading_state(s);

		// we need to update the state before calling pause(), because otherwise
		// it may think we're still checking files, even though we're just
		// leaving that state
		m_state = s;

		update_gauge();
		update_want_peers();
		update_want_tick();
		update_state_list();

		state_updated();

#ifndef TORRENT_DISABLE_LOGGING
		debug_log("set_state() %d", m_state);
#endif

		if (trigger_stop)
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("stop_when_ready triggered");
#endif
			// stop_when_ready is set, and we're transitioning from a downloading
			// state to a non-downloading state. pause the torrent. Note that
			// "downloading" is defined broadly to include any state where we
			// either upload or download (for the purpose of this flag).
			auto_managed(false);
			pause();
			m_stop_when_ready = false;
		}

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto& ext : m_extensions)
		{
			ext->on_state(state());
		}
#endif
	}